

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.h
# Opt level: O1

AffineSpace3ff * __thiscall
embree::SceneGraph::TransformNode::get
          (AffineSpace3ff *__return_storage_ptr__,TransformNode *this,float time)

{
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar1;
  Vector *pVVar2;
  Vector *pVVar3;
  ulong uVar4;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined8 uVar29;
  int iVar30;
  int iVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  
  uVar4 = (this->spaces).spaces.size_active;
  if (uVar4 < 2) {
    pAVar5 = (this->spaces).spaces.items;
    uVar29 = *(undefined8 *)((long)&(pAVar5->l).vx.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vx.field_0 = *(undefined8 *)&(pAVar5->l).vx.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vx.field_0 + 8) = uVar29;
    uVar29 = *(undefined8 *)((long)&(pAVar5->l).vy.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vy.field_0 = *(undefined8 *)&(pAVar5->l).vy.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vy.field_0 + 8) = uVar29;
    uVar29 = *(undefined8 *)((long)&(pAVar5->l).vz.field_0 + 8);
    *(undefined8 *)&(__return_storage_ptr__->l).vz.field_0 = *(undefined8 *)&(pAVar5->l).vz.field_0;
    *(undefined8 *)((long)&(__return_storage_ptr__->l).vz.field_0 + 8) = uVar29;
    fVar33 = (pAVar5->p).field_0.m128[0];
    fVar35 = (pAVar5->p).field_0.m128[1];
    fVar36 = (pAVar5->p).field_0.m128[2];
    fVar37 = (pAVar5->p).field_0.m128[3];
  }
  else {
    fVar32 = (this->spaces).time_range.lower;
    fVar32 = (time - fVar32) / ((this->spaces).time_range.upper - fVar32);
    fVar33 = floorf(fVar32);
    iVar31 = (int)uVar4;
    fVar32 = (float)(iVar31 + -1) * (fVar32 - fVar33);
    fVar33 = floorf(fVar32);
    iVar30 = 0;
    if (0 < (int)fVar33) {
      iVar30 = (int)fVar33;
    }
    iVar31 = iVar31 + -2;
    if (iVar30 < iVar31) {
      iVar31 = iVar30;
    }
    fVar32 = fVar32 - (float)iVar31;
    pAVar6 = (this->spaces).spaces.items;
    fVar34 = 1.0 - fVar32;
    pAVar1 = pAVar6 + (long)iVar31 + 1;
    fVar7 = (pAVar1->l).vx.field_0.m128[1];
    fVar8 = (pAVar1->l).vx.field_0.m128[2];
    fVar9 = (pAVar1->l).vx.field_0.m128[3];
    pAVar5 = pAVar6 + iVar31;
    fVar10 = (pAVar5->l).vx.field_0.m128[1];
    fVar11 = (pAVar5->l).vx.field_0.m128[2];
    fVar12 = (pAVar5->l).vx.field_0.m128[3];
    pVVar2 = &pAVar6[(long)iVar31 + 1].l.vy;
    fVar13 = (pVVar2->field_0).m128[0];
    fVar14 = (pVVar2->field_0).m128[1];
    fVar15 = (pVVar2->field_0).m128[2];
    fVar16 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[iVar31].l.vy;
    fVar17 = (pVVar2->field_0).m128[0];
    fVar18 = (pVVar2->field_0).m128[1];
    fVar19 = (pVVar2->field_0).m128[2];
    fVar20 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[(long)iVar31 + 1].l.vz;
    fVar21 = (pVVar2->field_0).m128[0];
    fVar22 = (pVVar2->field_0).m128[1];
    fVar23 = (pVVar2->field_0).m128[2];
    fVar24 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[iVar31].l.vz;
    fVar25 = (pVVar2->field_0).m128[0];
    fVar26 = (pVVar2->field_0).m128[1];
    fVar27 = (pVVar2->field_0).m128[2];
    fVar28 = (pVVar2->field_0).m128[3];
    pVVar2 = &pAVar6[(long)iVar31 + 1].p;
    pVVar3 = &pAVar6[iVar31].p;
    fVar33 = fVar34 * (pVVar3->field_0).m128[0] + fVar32 * (pVVar2->field_0).m128[0];
    fVar35 = fVar34 * (pVVar3->field_0).m128[1] + fVar32 * (pVVar2->field_0).m128[1];
    fVar36 = fVar34 * (pVVar3->field_0).m128[2] + fVar32 * (pVVar2->field_0).m128[2];
    fVar37 = fVar34 * (pVVar3->field_0).m128[3] + fVar32 * (pVVar2->field_0).m128[3];
    (__return_storage_ptr__->l).vx.field_0.m128[0] =
         (pAVar5->l).vx.field_0.m128[0] * fVar34 + (pAVar1->l).vx.field_0.m128[0] * fVar32;
    (__return_storage_ptr__->l).vx.field_0.m128[1] = fVar10 * fVar34 + fVar7 * fVar32;
    (__return_storage_ptr__->l).vx.field_0.m128[2] = fVar11 * fVar34 + fVar8 * fVar32;
    (__return_storage_ptr__->l).vx.field_0.m128[3] = fVar12 * fVar34 + fVar9 * fVar32;
    (__return_storage_ptr__->l).vy.field_0.m128[0] = fVar17 * fVar34 + fVar13 * fVar32;
    (__return_storage_ptr__->l).vy.field_0.m128[1] = fVar18 * fVar34 + fVar14 * fVar32;
    (__return_storage_ptr__->l).vy.field_0.m128[2] = fVar19 * fVar34 + fVar15 * fVar32;
    (__return_storage_ptr__->l).vy.field_0.m128[3] = fVar20 * fVar34 + fVar16 * fVar32;
    (__return_storage_ptr__->l).vz.field_0.m128[0] = fVar25 * fVar34 + fVar21 * fVar32;
    (__return_storage_ptr__->l).vz.field_0.m128[1] = fVar26 * fVar34 + fVar22 * fVar32;
    (__return_storage_ptr__->l).vz.field_0.m128[2] = fVar27 * fVar34 + fVar23 * fVar32;
    (__return_storage_ptr__->l).vz.field_0.m128[3] = fVar28 * fVar34 + fVar24 * fVar32;
  }
  (__return_storage_ptr__->p).field_0.m128[0] = fVar33;
  (__return_storage_ptr__->p).field_0.m128[1] = fVar35;
  (__return_storage_ptr__->p).field_0.m128[2] = fVar36;
  (__return_storage_ptr__->p).field_0.m128[3] = fVar37;
  return __return_storage_ptr__;
}

Assistant:

virtual AffineSpace3ff get(float time) const
      {
        if (spaces.size() <= 1) return spaces[0];

        int numTimeSteps = spaces.size();
        
        BBox1f time_range = spaces.time_range;
        time = frac((time-time_range.lower)/time_range.size());
        time = (numTimeSteps-1)*time;
        int   itime = (int)floor(time);
        itime = min(max(itime,0),(int)numTimeSteps-2);
        float ftime = time - (float)itime;
    
        const AffineSpace3ff xfm0 = spaces[itime+0];
        const AffineSpace3ff xfm1 = spaces[itime+1];
        const AffineSpace3ff xfm  = lerp(xfm0,xfm1,ftime);
        return xfm;
      }